

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

ExprPtr __thiscall pegmatite::debug(pegmatite *this,function<void_()> *fn)

{
  DebugExpr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  function<void_()> local_38;
  function<void_()> *local_18;
  function<void_()> *fn_local;
  
  local_18 = fn;
  fn_local = (function<void_()> *)this;
  this_00 = (DebugExpr *)operator_new(0x28);
  std::function<void_()>::function(&local_38,fn);
  anon_unknown.dwarf_50a29::DebugExpr::DebugExpr(this_00,&local_38);
  ExprPtr::ExprPtr((ExprPtr *)this,(Expr *)this_00);
  std::function<void_()>::~function(&local_38);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr debug(std::function<void()> fn)
{
	return ExprPtr(new DebugExpr(fn));
}